

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
google::protobuf::Arena::Create<std::__cxx11::string,std::__cxx11::string&>
          (Arena *arena,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar3;
  
  if (arena == (Arena *)0x0) {
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    (pbVar2->_M_dataplus)._M_p = (pointer)&pbVar2->field_2;
    pcVar1 = (args->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pbVar2,pcVar1,pcVar1 + args->_M_string_length);
  }
  else {
    pVar3 = AllocateAlignedWithCleanup(arena,0x20,(type_info *)&std::__cxx11::string::typeinfo);
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVar3.first;
    (pVar3.second)->elem = pbVar2;
    (pVar3.second)->cleanup = internal::arena_destruct_object<std::__cxx11::string>;
    (pbVar2->_M_dataplus)._M_p = (pointer)&pbVar2->field_2;
    pcVar1 = (args->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pbVar2,pcVar1,pcVar1 + args->_M_string_length);
  }
  return pbVar2;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* Create(Arena* arena, Args&&... args) {
    return CreateInternal<T>(arena, std::is_convertible<T*, MessageLite*>(),
                             static_cast<Args&&>(args)...);
  }